

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

void __thiscall
psy::C::Parser::parseTrivialSpecifier_AtFirst<psy::C::FunctionSpecifierSyntax>
          (Parser *this,SpecifierSyntax **spec,SyntaxKind specK)

{
  bool bVar1;
  bool bVar2;
  SyntaxToken *pSVar3;
  ostream *poVar4;
  FunctionSpecifierSyntax *pFVar5;
  IndexType IVar6;
  bool local_171;
  FunctionSpecifierSyntax *trivSpec;
  SyntaxToken local_158;
  byte local_119;
  SyntaxToken local_118;
  byte local_d9;
  SyntaxToken local_d8;
  byte local_9d;
  SyntaxToken local_90;
  SyntaxToken local_58;
  SyntaxKind local_1a;
  SpecifierSyntax **ppSStack_18;
  SyntaxKind specK_local;
  SpecifierSyntax **spec_local;
  Parser *this_local;
  
  local_1a = specK;
  ppSStack_18 = spec;
  spec_local = (SpecifierSyntax **)this;
  pSVar3 = peek(this,1);
  memcpy(&local_58,pSVar3,0x38);
  bVar2 = SyntaxFacts::isStorageClassSyntax(&local_58);
  local_9d = 0;
  local_d9 = 0;
  local_119 = 0;
  bVar1 = false;
  local_171 = true;
  if (!bVar2) {
    pSVar3 = peek(this,1);
    memcpy(&local_90,pSVar3,0x38);
    local_9d = 1;
    bVar2 = SyntaxFacts::isBasicTypeSpecifierSyntax(&local_90);
    local_171 = true;
    if (!bVar2) {
      pSVar3 = peek(this,1);
      memcpy(&local_d8,pSVar3,0x38);
      local_d9 = 1;
      bVar2 = SyntaxFacts::isTypeQualifierSyntax(&local_d8);
      local_171 = true;
      if (!bVar2) {
        pSVar3 = peek(this,1);
        memcpy(&local_118,pSVar3,0x38);
        local_119 = 1;
        bVar2 = SyntaxFacts::isFunctionSpecifierSyntax(&local_118);
        local_171 = true;
        if (!bVar2) {
          pSVar3 = peek(this,1);
          memcpy(&local_158,pSVar3,0x38);
          bVar1 = true;
          local_171 = SyntaxFacts::isExtGNU_AsmQualifierSyntax(&local_158);
        }
      }
    }
  }
  if (bVar1) {
    SyntaxToken::~SyntaxToken(&local_158);
  }
  if ((local_119 & 1) != 0) {
    SyntaxToken::~SyntaxToken(&local_118);
  }
  if ((local_d9 & 1) != 0) {
    SyntaxToken::~SyntaxToken(&local_d8);
  }
  if ((local_9d & 1) != 0) {
    SyntaxToken::~SyntaxToken(&local_90);
  }
  SyntaxToken::~SyntaxToken(&local_58);
  if (local_171 == false) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x56f);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,
                             "assert failure: <storage-class-specifier>, (builtin) <type-specifier>, <function-specifier>, <type-qualifier>, or<GNU-ext-asm-qualifier>"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    pFVar5 = makeNode<psy::C::FunctionSpecifierSyntax,psy::C::SyntaxKind&>(this,&local_1a);
    *ppSStack_18 = (SpecifierSyntax *)pFVar5;
    IVar6 = consume(this);
    (pFVar5->super_TrivialSpecifierSyntax).specTkIdx_ = IVar6;
  }
  return;
}

Assistant:

void Parser::parseTrivialSpecifier_AtFirst(SpecifierSyntax*& spec, SyntaxKind specK)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(SyntaxFacts::isStorageClassSyntax(peek())
                        || SyntaxFacts::isBasicTypeSpecifierSyntax(peek())
                        || SyntaxFacts::isTypeQualifierSyntax(peek())
                        || SyntaxFacts::isFunctionSpecifierSyntax(peek())
                        || SyntaxFacts::isExtGNU_AsmQualifierSyntax(peek()),
                  return,
                  "assert failure: <storage-class-specifier>, "
                                  "(builtin) <type-specifier>, "
                                  "<function-specifier>, "
                                  "<type-qualifier>, or"
                                  "<GNU-ext-asm-qualifier>");

    auto trivSpec = makeNode<SpecT>(specK);
    spec = trivSpec;
    trivSpec->specTkIdx_ = consume();
}